

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue offset;
  JSContext *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  undefined1 in_stack_00000078 [16];
  undefined1 in_stack_000000a0 [16];
  
  JVar1 = js_typed_array_set_internal
                    (in_stack_00000060,(JSValue)in_stack_00000078,(JSValue)in_stack_00000068,
                     (JSValue)in_stack_000000a0);
  return JVar1;
}

Assistant:

static JSValue js_typed_array_set(JSContext *ctx,
                                  JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValueConst offset = JS_UNDEFINED;
    if (argc > 1) {
        offset = argv[1];
    }
    return js_typed_array_set_internal(ctx, this_val, argv[0], offset);
}